

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_make_symlink
                  (char *file,wchar_t line,char *newpath,char *linkto,wchar_t targetIsDir)

{
  int iVar1;
  wchar_t targetIsDir_local;
  char *linkto_local;
  char *newpath_local;
  wchar_t line_local;
  char *file_local;
  
  assertion_count(file,line);
  iVar1 = symlink(linkto,newpath);
  if (iVar1 != 0) {
    failure_start(file,line,"Could not create symlink");
    logprintf("   New link: %s\n",newpath);
    logprintf("   Old name: %s\n",linkto);
    failure_finish((void *)0x0);
  }
  file_local._4_4_ = (wchar_t)(iVar1 == 0);
  return file_local._4_4_;
}

Assistant:

int
assertion_make_symlink(const char *file, int line,
    const char *newpath, const char *linkto, int targetIsDir)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	assertion_count(file, line);
	if (my_CreateSymbolicLinkA(newpath, linkto, targetIsDir))
		return (1);
#elif HAVE_SYMLINK
	(void)targetIsDir; /* UNUSED */
	assertion_count(file, line);
	if (0 == symlink(linkto, newpath))
		return (1);
#else
	(void)targetIsDir; /* UNUSED */
#endif
	failure_start(file, line, "Could not create symlink");
	logprintf("   New link: %s\n", newpath);
	logprintf("   Old name: %s\n", linkto);
	failure_finish(NULL);
	return(0);
}